

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O3

void __thiscall cplus::lang::ByteArray::freeMemory(ByteArray *this)

{
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  
  uVar1 = this->size;
  if (uVar1 == this->bufferSize) {
    return;
  }
  pcVar3 = (char *)operator_new__(uVar1);
  pcVar2 = this->buffer;
  if (uVar1 == 0) {
    if (pcVar2 == (char *)0x0) {
      sVar5 = 0;
      goto LAB_0011ab6f;
    }
  }
  else {
    uVar4 = 0;
    do {
      pcVar3[uVar4] = pcVar2[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  operator_delete__(pcVar2);
  sVar5 = this->size;
LAB_0011ab6f:
  this->buffer = pcVar3;
  this->bufferSize = sVar5;
  return;
}

Assistant:

void ByteArray::freeMemory() {
			if (size != bufferSize) {
				auto newBuffer = new char[size];
				for (size_t index = 0; index < size; index++) {
					newBuffer[index] = buffer[index];
				}
				delete[] buffer;
				buffer = newBuffer;
				bufferSize = size;
			}
		}